

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_29(QPDF *pdf,char *arg2)

{
  ostream *poVar1;
  QPDFObjectHandle root1;
  QPDFWriter w;
  QPDFObjectHandle root2;
  QPDFObjectHandle dict;
  shared_ptr<QPDF> other;
  shared_ptr<QPDF> other2;
  allocator<char> local_a9;
  string local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_98 [2];
  allocator<char> local_69;
  allocator<char> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_58;
  QPDF *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2> local_38 [2];
  
  if (arg2 != (char *)0x0) {
    QPDF::create();
    QPDF::processFile((char *)local_48,arg2);
    QPDFObjectHandle::newDictionary();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"/QTest",&local_a9);
    QPDF::getTrailer();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"/QTest",&local_69);
    QPDFObjectHandle::getKey(local_a8);
    QPDFObjectHandle::replaceKey((string *)&local_58,(QPDFObjectHandle *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    std::__cxx11::string::~string((string *)local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    std::__cxx11::string::~string((string *)local_98);
    QPDF::getTrailer();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"/QTest",(allocator<char> *)local_a8);
    QPDFObjectHandle::replaceKey((string *)local_38,(QPDFObjectHandle *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38[0]._M_refcount);
    QPDFWriter::QPDFWriter((QPDFWriter *)local_98,local_48,"a.pdf");
    QPDFWriter::write();
    poVar1 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98[0]._M_refcount);
    QPDF::create();
    QPDF::emptyPDF();
    QPDFObjectHandle::newDictionary();
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_58,local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98[0]._M_refcount);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"/QTest",local_68);
    QPDF::getRoot();
    QPDFObjectHandle::replaceKey((string *)&local_58,(QPDFObjectHandle *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    std::__cxx11::string::~string((string *)local_98);
    QPDF::getTrailer();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"/QTest",local_68);
    QPDFObjectHandle::replaceKey(local_a8,(QPDFObjectHandle *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    local_98[0]._M_ptr = (element_type *)0x0;
    local_98[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>::operator=
              (local_38,(__shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2> *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98[0]._M_refcount);
    QPDFWriter::QPDFWriter((QPDFWriter *)local_98,local_48,"a.pdf");
    QPDFWriter::write();
    poVar1 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98[0]._M_refcount);
    QPDF::getRoot();
    QPDF::getRoot();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"/Oops",&local_a9);
    QPDFObjectHandle::replaceKey(local_a8,(QPDFObjectHandle *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38[0]._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x449,"void test_29(QPDF &, const char *)");
}

Assistant:

static void
test_29(QPDF& pdf, char const* arg2)
{
    // Detect mixed objects in QPDFWriter
    assert(arg2 != nullptr);
    auto other = QPDF::create();
    other->processFile(arg2);
    // We need to create a QPDF with mixed ownership to exercise
    // QPDFWriter's ownership check. To do this, we have to sneak the
    // foreign object inside an ownerless direct object to avoid
    // detection prior to calling QPDFWriter. Maybe a future version
    // of qpdf will be able prevent creating mixed ownership. Another
    // way to fake it out would be to call setDescription to
    // explicitly change the ownership to the wrong value.
    auto dict = QPDFObjectHandle::newDictionary();
    dict.replaceKey("/QTest", pdf.getTrailer().getKey("/QTest"));
    other->getTrailer().replaceKey("/QTest", dict);

    try {
        QPDFWriter w(*other, "a.pdf");
        w.write();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }

    // Make sure deleting the other source doesn't prevent detection.
    auto other2 = QPDF::create();
    other2->emptyPDF();
    dict = QPDFObjectHandle::newDictionary();
    dict.replaceKey("/QTest", other2->getRoot());
    other->getTrailer().replaceKey("/QTest", dict);
    other2 = nullptr;
    try {
        QPDFWriter w(*other, "a.pdf");
        w.write();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }

    // Detect adding a foreign object
    auto root1 = pdf.getRoot();
    auto root2 = other->getRoot();
    try {
        root1.replaceKey("/Oops", root2);
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
}